

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_3_2_core.cpp
# Opt level: O2

void __thiscall
QOpenGLFunctions_3_2_Core::~QOpenGLFunctions_3_2_Core(QOpenGLFunctions_3_2_Core *this)

{
  QAtomicInt *pQVar1;
  
  (this->super_QAbstractOpenGLFunctions)._vptr_QAbstractOpenGLFunctions =
       (_func_int **)&PTR__QOpenGLFunctions_3_2_Core_001a1bb0;
  if (this->d_1_0_Core != (QOpenGLFunctions_1_0_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_0_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_1_Core != (QOpenGLFunctions_1_1_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_1_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_2_Core != (QOpenGLFunctions_1_2_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_2_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_3_Core != (QOpenGLFunctions_1_3_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_3_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_4_Core != (QOpenGLFunctions_1_4_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_4_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_5_Core != (QOpenGLFunctions_1_5_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_5_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_2_0_Core != (QOpenGLFunctions_2_0_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_2_0_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_2_1_Core != (QOpenGLFunctions_2_1_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_2_1_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_3_0_Core != (QOpenGLFunctions_3_0_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_3_0_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_3_1_Core != (QOpenGLFunctions_3_1_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_3_1_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_3_2_Core != (QOpenGLFunctions_3_2_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_3_2_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    QAbstractOpenGLFunctions::~QAbstractOpenGLFunctions(&this->super_QAbstractOpenGLFunctions);
    return;
  }
  QAbstractOpenGLFunctions::~QAbstractOpenGLFunctions(&this->super_QAbstractOpenGLFunctions);
  return;
}

Assistant:

QOpenGLFunctions_3_2_Core::~QOpenGLFunctions_3_2_Core()
{
    if (d_1_0_Core) {
        d_1_0_Core->refs.deref();
        Q_ASSERT(d_1_0_Core->refs.loadRelaxed());
    }
    if (d_1_1_Core) {
        d_1_1_Core->refs.deref();
        Q_ASSERT(d_1_1_Core->refs.loadRelaxed());
    }
    if (d_1_2_Core) {
        d_1_2_Core->refs.deref();
        Q_ASSERT(d_1_2_Core->refs.loadRelaxed());
    }
    if (d_1_3_Core) {
        d_1_3_Core->refs.deref();
        Q_ASSERT(d_1_3_Core->refs.loadRelaxed());
    }
    if (d_1_4_Core) {
        d_1_4_Core->refs.deref();
        Q_ASSERT(d_1_4_Core->refs.loadRelaxed());
    }
    if (d_1_5_Core) {
        d_1_5_Core->refs.deref();
        Q_ASSERT(d_1_5_Core->refs.loadRelaxed());
    }
    if (d_2_0_Core) {
        d_2_0_Core->refs.deref();
        Q_ASSERT(d_2_0_Core->refs.loadRelaxed());
    }
    if (d_2_1_Core) {
        d_2_1_Core->refs.deref();
        Q_ASSERT(d_2_1_Core->refs.loadRelaxed());
    }
    if (d_3_0_Core) {
        d_3_0_Core->refs.deref();
        Q_ASSERT(d_3_0_Core->refs.loadRelaxed());
    }
    if (d_3_1_Core) {
        d_3_1_Core->refs.deref();
        Q_ASSERT(d_3_1_Core->refs.loadRelaxed());
    }
    if (d_3_2_Core) {
        d_3_2_Core->refs.deref();
        Q_ASSERT(d_3_2_Core->refs.loadRelaxed());
    }
}